

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdldl.c
# Opt level: O1

void QDLDL_Lsolve(QDLDL_int n,QDLDL_int *Lp,QDLDL_int *Li,QDLDL_float *Lx,QDLDL_float *x)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (0 < n) {
    lVar2 = 0;
    do {
      lVar3 = Lp[lVar2];
      lVar1 = Lp[lVar2 + 1];
      if (lVar3 < lVar1) {
        do {
          x[Li[lVar3]] = x[Li[lVar3]] - Lx[lVar3] * x[lVar2];
          lVar3 = lVar3 + 1;
        } while (lVar1 != lVar3);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != n);
  }
  return;
}

Assistant:

void QDLDL_Lsolve(const QDLDL_int    n,
                  const QDLDL_int*   Lp,
                  const QDLDL_int*   Li,
                  const QDLDL_float* Lx,
                  QDLDL_float* x){

QDLDL_int i,j;
  for(i = 0; i < n; i++){
      for(j = Lp[i]; j < Lp[i+1]; j++){
          x[Li[j]] -= Lx[j]*x[i];
      }
  }
}